

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stb_image.h
# Opt level: O2

int stbi__create_png_image_raw
              (stbi__png *a,stbi_uc *raw,stbi__uint32 raw_len,int out_n,stbi__uint32 x,
              stbi__uint32 y,int depth,int color)

{
  ushort *puVar1;
  int iVar2;
  long lVar3;
  uint uVar4;
  byte bVar5;
  uint uVar6;
  uint uVar7;
  uint uVar8;
  uint uVar9;
  stbi_uc *psVar10;
  long lVar11;
  byte *pbVar12;
  stbi__uint32 sVar13;
  long lVar14;
  long lVar15;
  ulong uVar16;
  long lVar17;
  uint uVar18;
  ulong uVar19;
  uint uVar20;
  uint uVar21;
  byte bVar23;
  int iVar24;
  ulong uVar25;
  long lVar26;
  long lVar27;
  stbi_uc *psVar28;
  byte *pbVar29;
  ulong uVar30;
  bool bVar31;
  stbi_uc *local_e8;
  stbi_uc *local_d0;
  byte *local_c8;
  ulong local_70;
  ulong uVar22;
  
  bVar31 = depth == 0x10;
  uVar6 = x * out_n;
  uVar7 = uVar6 << bVar31;
  iVar2 = a->s->img_n;
  uVar8 = iVar2 << bVar31;
  if (iVar2 + 1 != out_n && iVar2 != out_n) {
    __assert_fail("out_n == s->img_n || out_n == s->img_n+1",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/sienkiewiczkm[P]arealights/dependencies/stb/stb_image.h"
                  ,0x10c6,
                  "int stbi__create_png_image_raw(stbi__png *, stbi_uc *, stbi__uint32, int, stbi__uint32, stbi__uint32, int, int)"
                 );
  }
  psVar10 = (stbi_uc *)stbi__malloc_mad3(x,y,out_n << bVar31,0);
  a->out = psVar10;
  if (psVar10 == (stbi_uc *)0x0) {
    stbi__g_failure_reason = "outofmem";
  }
  else {
    uVar9 = iVar2 * x;
    uVar20 = uVar9 * depth + 7 >> 3;
    uVar22 = (ulong)uVar20;
    if (raw_len < (uVar20 + 1) * y) {
      stbi__g_failure_reason = "not enough pixels";
    }
    else {
      lVar11 = (long)iVar2;
      lVar26 = (long)(out_n << bVar31);
      lVar27 = -lVar26;
      lVar17 = -(ulong)uVar7;
      uVar21 = 0;
      uVar25 = 0;
      local_70 = (ulong)x;
      while( true ) {
        if (uVar25 == y) {
          if (7 < depth) {
            if (depth != 0x10) {
              return 1;
            }
            psVar10 = a->out;
            for (lVar11 = 0; uVar6 * y != (int)lVar11; lVar11 = lVar11 + 1) {
              puVar1 = (ushort *)(psVar10 + lVar11 * 2);
              *puVar1 = *puVar1 << 8 | *puVar1 >> 8;
            }
            return 1;
          }
          uVar8 = 0;
          uVar25 = 0;
          do {
            if (uVar25 == y) {
              return 1;
            }
            bVar5 = 1;
            if (color == 0) {
              bVar5 = ""[depth];
            }
            uVar19 = (ulong)uVar8;
            psVar10 = a->out;
            uVar16 = (ulong)(uVar7 * (int)uVar25);
            if (depth == 4) {
              lVar11 = (uVar6 - uVar22) + uVar19;
              lVar17 = 0;
              for (uVar20 = uVar9; 1 < (int)uVar20; uVar20 = uVar20 - 2) {
                psVar10[lVar17 * 2 + uVar19] = (psVar10[lVar17 + lVar11] >> 4) * bVar5;
                psVar10[lVar17 * 2 + uVar19 + 1] = (psVar10[lVar17 + lVar11] & 0xf) * bVar5;
                lVar17 = lVar17 + 1;
              }
              if (uVar20 == 1) {
                psVar10[lVar17 * 2 + uVar19] = (psVar10[lVar17 + lVar11] >> 4) * bVar5;
              }
            }
            else {
              pbVar29 = psVar10 + ((uVar6 + uVar16) - uVar22);
              if (depth == 2) {
                psVar10 = psVar10 + uVar19 + 3;
                for (uVar20 = uVar9; 3 < (int)uVar20; uVar20 = uVar20 - 4) {
                  psVar10[-3] = (*pbVar29 >> 6) * bVar5;
                  psVar10[-2] = (*pbVar29 >> 4 & 3) * bVar5;
                  psVar10[-1] = (*pbVar29 >> 2 & 3) * bVar5;
                  *psVar10 = (*pbVar29 & 3) * bVar5;
                  pbVar29 = pbVar29 + 1;
                  psVar10 = psVar10 + 4;
                }
                if (((0 < (int)uVar20) && (psVar10[-3] = (*pbVar29 >> 6) * bVar5, uVar20 != 1)) &&
                   (psVar10[-2] = (*pbVar29 >> 4 & 3) * bVar5, uVar20 == 3)) {
                  psVar10[-1] = (*pbVar29 >> 2 & 3) * bVar5;
                }
              }
              else if (depth == 1) {
                pbVar12 = psVar10 + uVar19 + 7;
                for (uVar20 = uVar9; 7 < (int)uVar20; uVar20 = uVar20 - 8) {
                  pbVar12[-7] = (char)*pbVar29 >> 7 & bVar5;
                  pbVar12[-6] = (char)(*pbVar29 * '\x02') >> 7 & bVar5;
                  pbVar12[-5] = (char)(*pbVar29 << 2) >> 7 & bVar5;
                  pbVar12[-4] = (char)(*pbVar29 << 3) >> 7 & bVar5;
                  pbVar12[-3] = (char)(*pbVar29 << 4) >> 7 & bVar5;
                  pbVar12[-2] = (char)(*pbVar29 << 5) >> 7 & bVar5;
                  pbVar12[-1] = (char)(*pbVar29 << 6) >> 7 & bVar5;
                  bVar23 = bVar5;
                  if ((*pbVar29 & 1) == 0) {
                    bVar23 = 0;
                  }
                  *pbVar12 = bVar23;
                  pbVar29 = pbVar29 + 1;
                  pbVar12 = pbVar12 + 8;
                }
                if (((((0 < (int)uVar20) && (pbVar12[-7] = (char)*pbVar29 >> 7 & bVar5, uVar20 != 1)
                      ) && ((pbVar12[-6] = (char)(*pbVar29 * '\x02') >> 7 & bVar5, 2 < uVar20 &&
                            ((pbVar12[-5] = (char)(*pbVar29 << 2) >> 7 & bVar5, uVar20 != 3 &&
                             (pbVar12[-4] = (char)(*pbVar29 << 3) >> 7 & bVar5, 4 < uVar20)))))) &&
                    (pbVar12[-3] = (char)(*pbVar29 << 4) >> 7 & bVar5, uVar20 != 5)) &&
                   (pbVar12[-2] = (char)(*pbVar29 << 5) >> 7 & bVar5, uVar20 == 7)) {
                  pbVar12[-1] = (char)(*pbVar29 << 6) >> 7 & bVar5;
                }
              }
            }
            if (iVar2 != out_n) {
              psVar10 = a->out;
              if (iVar2 == 1) {
                uVar20 = x * 2 - 1;
                for (iVar24 = 0; -1 < (int)((x - 1) + iVar24); iVar24 = iVar24 + -1) {
                  psVar10[uVar20 + uVar16] = 0xff;
                  psVar10[(uVar20 - 1) + uVar16] = psVar10[((x - 1) + iVar24 & 0x7fffffff) + uVar16]
                  ;
                  uVar20 = uVar20 - 2;
                }
              }
              else {
                iVar24 = x - 1;
                uVar21 = x * 4;
                uVar20 = x * 3;
                if (iVar2 != 3) {
                  __assert_fail("img_n == 3",
                                "/workspace/llm4binary/github/license_all_cmakelists_1510/sienkiewiczkm[P]arealights/dependencies/stb/stb_image.h"
                                ,0x1171,
                                "int stbi__create_png_image_raw(stbi__png *, stbi_uc *, stbi__uint32, int, stbi__uint32, stbi__uint32, int, int)"
                               );
                }
                while( true ) {
                  uVar20 = uVar20 - 3;
                  if (iVar24 < 0) break;
                  psVar10[(uVar21 - 1) + uVar16] = 0xff;
                  psVar10[(uVar21 - 2) + uVar16] = psVar10[(ulong)uVar20 + uVar16 + 2];
                  psVar10[(uVar21 - 3) + uVar16] = psVar10[(ulong)uVar20 + uVar16 + 1];
                  psVar10[(uVar21 - 4) + uVar16] = psVar10[uVar20 + uVar16];
                  iVar24 = iVar24 + -1;
                  uVar21 = uVar21 - 4;
                }
              }
            }
            uVar25 = uVar25 + 1;
            uVar8 = uVar8 + uVar7;
          } while( true );
        }
        uVar16 = (ulong)*raw;
        if (4 < uVar16) break;
        local_e8 = a->out + uVar7 * (int)uVar25;
        if (depth < 8) {
          if (x < uVar20) {
            __assert_fail("img_width_bytes <= x",
                          "/workspace/llm4binary/github/license_all_cmakelists_1510/sienkiewiczkm[P]arealights/dependencies/stb/stb_image.h"
                          ,0x10da,
                          "int stbi__create_png_image_raw(stbi__png *, stbi_uc *, stbi__uint32, int, stbi__uint32, stbi__uint32, int, int)"
                         );
          }
          local_e8 = local_e8 + (uVar6 - uVar20);
          uVar8 = 1;
          local_70 = uVar22;
        }
        if (uVar25 == 0) {
          uVar16 = (ulong)""[uVar16];
        }
        uVar19 = 0;
        if (0 < (int)uVar8) {
          uVar19 = (ulong)uVar8;
        }
        for (uVar30 = 0; uVar19 != uVar30; uVar30 = uVar30 + 1) {
          switch(uVar16) {
          case 0:
          case 1:
          case 5:
          case 6:
            bVar5 = raw[uVar30 + 1];
            break;
          case 2:
            bVar5 = local_e8[uVar30 + lVar17];
            goto LAB_001232c1;
          case 3:
            bVar5 = local_e8[uVar30 + lVar17] >> 1;
LAB_001232c1:
            bVar5 = bVar5 + raw[uVar30 + 1];
            break;
          case 4:
            bVar5 = raw[uVar30 + 1];
            iVar24 = stbi__paeth(0,(uint)local_e8[uVar30 + lVar17],0);
            bVar5 = (char)iVar24 + bVar5;
            break;
          default:
            goto switchD_00123280_default;
          }
          local_e8[uVar30] = bVar5;
switchD_00123280_default:
        }
        lVar14 = (long)(int)uVar8;
        if (depth == 8) {
          lVar15 = (long)out_n;
          lVar3 = lVar11;
          if (iVar2 != out_n) {
            local_e8[lVar11] = 0xff;
          }
LAB_00123341:
          local_c8 = raw + lVar3 + 1;
        }
        else {
          if (depth == 0x10) {
            lVar15 = lVar26;
            lVar3 = lVar14;
            if (iVar2 != out_n) {
              local_e8[lVar14] = 0xff;
              local_e8[lVar14 + 1] = 0xff;
            }
            goto LAB_00123341;
          }
          local_c8 = raw + 2;
          lVar15 = 1;
        }
        psVar10 = local_e8 + lVar15;
        local_d0 = local_e8 + lVar15 + lVar17;
        if (depth < 8 || iVar2 == out_n) {
          uVar18 = ((int)local_70 + -1) * uVar8;
          switch(uVar16) {
          case 0:
            memcpy(psVar10,local_c8,(long)(int)uVar18);
            break;
          case 1:
            uVar4 = uVar18;
            if ((int)uVar18 < 1) {
              uVar4 = 0;
            }
            for (uVar16 = 0; uVar4 != uVar16; uVar16 = uVar16 + 1) {
              psVar10[uVar16] = psVar10[uVar16 - lVar14] + local_c8[uVar16];
            }
            break;
          case 2:
            uVar4 = uVar18;
            if ((int)uVar18 < 1) {
              uVar4 = 0;
            }
            for (uVar16 = 0; uVar4 != uVar16; uVar16 = uVar16 + 1) {
              psVar10[uVar16] = psVar10[uVar16 + lVar17] + local_c8[uVar16];
            }
            break;
          case 3:
            uVar4 = uVar18;
            if ((int)uVar18 < 1) {
              uVar4 = 0;
            }
            uVar16 = (ulong)uVar4;
            pbVar29 = local_c8;
            while (bVar31 = uVar16 != 0, uVar16 = uVar16 - 1, bVar31) {
              *psVar10 = (char)((uint)psVar10[-lVar14] + (uint)psVar10[lVar17] >> 1) + *pbVar29;
              psVar10 = psVar10 + 1;
              pbVar29 = pbVar29 + 1;
            }
            break;
          case 4:
            uVar4 = uVar18;
            if ((int)uVar18 < 1) {
              uVar4 = 0;
            }
            for (uVar16 = 0; uVar16 != uVar4; uVar16 = uVar16 + 1) {
              bVar5 = local_c8[uVar16];
              iVar24 = stbi__paeth((uint)psVar10[uVar16 - lVar14],(uint)local_d0[uVar16],
                                   (uint)local_d0[uVar16 - lVar14]);
              psVar10[uVar16] = (char)iVar24 + bVar5;
            }
            break;
          case 5:
            uVar4 = uVar18;
            if ((int)uVar18 < 1) {
              uVar4 = 0;
            }
            for (uVar16 = 0; uVar4 != uVar16; uVar16 = uVar16 + 1) {
              psVar10[uVar16] = (psVar10[uVar16 - lVar14] >> 1) + local_c8[uVar16];
            }
            break;
          case 6:
            uVar4 = uVar18;
            if ((int)uVar18 < 1) {
              uVar4 = 0;
            }
            for (uVar16 = 0; uVar4 != uVar16; uVar16 = uVar16 + 1) {
              psVar10[uVar16] = psVar10[uVar16 - lVar14] + local_c8[uVar16];
            }
          }
          local_c8 = local_c8 + (int)uVar18;
        }
        else {
          if (iVar2 + 1 != out_n) {
            __assert_fail("img_n+1 == out_n",
                          "/workspace/llm4binary/github/license_all_cmakelists_1510/sienkiewiczkm[P]arealights/dependencies/stb/stb_image.h"
                          ,0x1118,
                          "int stbi__create_png_image_raw(stbi__png *, stbi_uc *, stbi__uint32, int, stbi__uint32, stbi__uint32, int, int)"
                         );
          }
          switch(uVar16) {
          case 0:
            sVar13 = x;
            while (sVar13 = sVar13 - 1, sVar13 != 0) {
              for (uVar16 = 0; uVar19 != uVar16; uVar16 = uVar16 + 1) {
                psVar10[uVar16] = local_c8[uVar16];
              }
              psVar10[lVar14] = 0xff;
              local_c8 = local_c8 + lVar14;
              psVar10 = psVar10 + lVar26;
            }
            break;
          case 1:
            sVar13 = x;
            while (sVar13 = sVar13 - 1, sVar13 != 0) {
              for (uVar16 = 0; uVar19 != uVar16; uVar16 = uVar16 + 1) {
                psVar10[uVar16] = psVar10[uVar16 + lVar27] + local_c8[uVar16];
              }
              psVar10[lVar14] = 0xff;
              local_c8 = local_c8 + lVar14;
              psVar10 = psVar10 + lVar26;
            }
            break;
          case 2:
            sVar13 = x;
            while (sVar13 = sVar13 - 1, sVar13 != 0) {
              for (uVar16 = 0; uVar19 != uVar16; uVar16 = uVar16 + 1) {
                psVar10[uVar16] = psVar10[uVar16 + lVar17] + local_c8[uVar16];
              }
              psVar10[lVar14] = 0xff;
              local_c8 = local_c8 + lVar14;
              psVar10 = psVar10 + lVar26;
            }
            break;
          case 3:
            sVar13 = x;
            while (sVar13 = sVar13 - 1, pbVar29 = local_c8, psVar28 = psVar10, uVar16 = uVar19,
                  sVar13 != 0) {
              while (uVar16 != 0) {
                *psVar28 = (char)((uint)psVar28[lVar27] + (uint)psVar28[lVar17] >> 1) + *pbVar29;
                pbVar29 = pbVar29 + 1;
                psVar28 = psVar28 + 1;
                uVar16 = uVar16 - 1;
              }
              psVar10[lVar14] = 0xff;
              local_c8 = local_c8 + lVar14;
              psVar10 = psVar10 + lVar26;
            }
            break;
          case 4:
            psVar28 = local_e8 + lVar15 + lVar27;
            local_e8 = local_e8 + lVar15 + (lVar27 - (ulong)uVar7);
            sVar13 = x;
            while (sVar13 = sVar13 - 1, sVar13 != 0) {
              for (uVar16 = 0; uVar19 != uVar16; uVar16 = uVar16 + 1) {
                bVar5 = local_c8[uVar16];
                iVar24 = stbi__paeth((uint)psVar28[uVar16],(uint)local_d0[uVar16],
                                     (uint)local_e8[uVar16]);
                psVar10[uVar16] = (char)iVar24 + bVar5;
              }
              psVar10[lVar14] = 0xff;
              local_c8 = local_c8 + lVar14;
              psVar10 = psVar10 + lVar26;
              local_d0 = local_d0 + lVar26;
              psVar28 = psVar28 + lVar26;
              local_e8 = local_e8 + lVar26;
            }
            break;
          case 5:
            sVar13 = x;
            while (sVar13 = sVar13 - 1, sVar13 != 0) {
              for (uVar16 = 0; uVar19 != uVar16; uVar16 = uVar16 + 1) {
                psVar10[uVar16] = (psVar10[uVar16 + lVar27] >> 1) + local_c8[uVar16];
              }
              psVar10[lVar14] = 0xff;
              local_c8 = local_c8 + lVar14;
              psVar10 = psVar10 + lVar26;
            }
            break;
          case 6:
            sVar13 = x;
            while (sVar13 = sVar13 - 1, sVar13 != 0) {
              for (uVar16 = 0; uVar19 != uVar16; uVar16 = uVar16 + 1) {
                psVar10[uVar16] = psVar10[uVar16 + lVar27] + local_c8[uVar16];
              }
              psVar10[lVar14] = 0xff;
              local_c8 = local_c8 + lVar14;
              psVar10 = psVar10 + lVar26;
            }
          }
          if (depth == 0x10) {
            psVar10 = a->out + (long)(int)(uVar8 + 1) + (ulong)uVar21;
            sVar13 = x;
            while (bVar31 = sVar13 != 0, sVar13 = sVar13 - 1, bVar31) {
              *psVar10 = 0xff;
              psVar10 = psVar10 + lVar26;
            }
          }
        }
        uVar25 = uVar25 + 1;
        uVar21 = uVar21 + uVar7;
        raw = local_c8;
      }
      stbi__g_failure_reason = "invalid filter";
    }
  }
  return 0;
}

Assistant:

static int stbi__create_png_image_raw(stbi__png *a, stbi_uc *raw, stbi__uint32 raw_len, int out_n, stbi__uint32 x, stbi__uint32 y, int depth, int color)
{
   int bytes = (depth == 16? 2 : 1);
   stbi__context *s = a->s;
   stbi__uint32 i,j,stride = x*out_n*bytes;
   stbi__uint32 img_len, img_width_bytes;
   int k;
   int img_n = s->img_n; // copy it into a local for later

   int output_bytes = out_n*bytes;
   int filter_bytes = img_n*bytes;
   int width = x;

   STBI_ASSERT(out_n == s->img_n || out_n == s->img_n+1);
   a->out = (stbi_uc *) stbi__malloc_mad3(x, y, output_bytes, 0); // extra bytes to write off the end into
   if (!a->out) return stbi__err("outofmem", "Out of memory");

   img_width_bytes = (((img_n * x * depth) + 7) >> 3);
   img_len = (img_width_bytes + 1) * y;
   // we used to check for exact match between raw_len and img_len on non-interlaced PNGs,
   // but issue #276 reported a PNG in the wild that had extra data at the end (all zeros),
   // so just check for raw_len < img_len always.
   if (raw_len < img_len) return stbi__err("not enough pixels","Corrupt PNG");

   for (j=0; j < y; ++j) {
      stbi_uc *cur = a->out + stride*j;
      stbi_uc *prior;
      int filter = *raw++;

      if (filter > 4)
         return stbi__err("invalid filter","Corrupt PNG");

      if (depth < 8) {
         STBI_ASSERT(img_width_bytes <= x);
         cur += x*out_n - img_width_bytes; // store output to the rightmost img_len bytes, so we can decode in place
         filter_bytes = 1;
         width = img_width_bytes;
      }
      prior = cur - stride; // bugfix: need to compute this after 'cur +=' computation above

      // if first row, use special filter that doesn't sample previous row
      if (j == 0) filter = first_row_filter[filter];

      // handle first byte explicitly
      for (k=0; k < filter_bytes; ++k) {
         switch (filter) {
            case STBI__F_none       : cur[k] = raw[k]; break;
            case STBI__F_sub        : cur[k] = raw[k]; break;
            case STBI__F_up         : cur[k] = STBI__BYTECAST(raw[k] + prior[k]); break;
            case STBI__F_avg        : cur[k] = STBI__BYTECAST(raw[k] + (prior[k]>>1)); break;
            case STBI__F_paeth      : cur[k] = STBI__BYTECAST(raw[k] + stbi__paeth(0,prior[k],0)); break;
            case STBI__F_avg_first  : cur[k] = raw[k]; break;
            case STBI__F_paeth_first: cur[k] = raw[k]; break;
         }
      }

      if (depth == 8) {
         if (img_n != out_n)
            cur[img_n] = 255; // first pixel
         raw += img_n;
         cur += out_n;
         prior += out_n;
      } else if (depth == 16) {
         if (img_n != out_n) {
            cur[filter_bytes]   = 255; // first pixel top byte
            cur[filter_bytes+1] = 255; // first pixel bottom byte
         }
         raw += filter_bytes;
         cur += output_bytes;
         prior += output_bytes;
      } else {
         raw += 1;
         cur += 1;
         prior += 1;
      }

      // this is a little gross, so that we don't switch per-pixel or per-component
      if (depth < 8 || img_n == out_n) {
         int nk = (width - 1)*filter_bytes;
         #define STBI__CASE(f) \
             case f:     \
                for (k=0; k < nk; ++k)
         switch (filter) {
            // "none" filter turns into a memcpy here; make that explicit.
            case STBI__F_none:         memcpy(cur, raw, nk); break;
            STBI__CASE(STBI__F_sub)          { cur[k] = STBI__BYTECAST(raw[k] + cur[k-filter_bytes]); } break;
            STBI__CASE(STBI__F_up)           { cur[k] = STBI__BYTECAST(raw[k] + prior[k]); } break;
            STBI__CASE(STBI__F_avg)          { cur[k] = STBI__BYTECAST(raw[k] + ((prior[k] + cur[k-filter_bytes])>>1)); } break;
            STBI__CASE(STBI__F_paeth)        { cur[k] = STBI__BYTECAST(raw[k] + stbi__paeth(cur[k-filter_bytes],prior[k],prior[k-filter_bytes])); } break;
            STBI__CASE(STBI__F_avg_first)    { cur[k] = STBI__BYTECAST(raw[k] + (cur[k-filter_bytes] >> 1)); } break;
            STBI__CASE(STBI__F_paeth_first)  { cur[k] = STBI__BYTECAST(raw[k] + stbi__paeth(cur[k-filter_bytes],0,0)); } break;
         }
         #undef STBI__CASE
         raw += nk;
      } else {
         STBI_ASSERT(img_n+1 == out_n);
         #define STBI__CASE(f) \
             case f:     \
                for (i=x-1; i >= 1; --i, cur[filter_bytes]=255,raw+=filter_bytes,cur+=output_bytes,prior+=output_bytes) \
                   for (k=0; k < filter_bytes; ++k)
         switch (filter) {
            STBI__CASE(STBI__F_none)         { cur[k] = raw[k]; } break;
            STBI__CASE(STBI__F_sub)          { cur[k] = STBI__BYTECAST(raw[k] + cur[k- output_bytes]); } break;
            STBI__CASE(STBI__F_up)           { cur[k] = STBI__BYTECAST(raw[k] + prior[k]); } break;
            STBI__CASE(STBI__F_avg)          { cur[k] = STBI__BYTECAST(raw[k] + ((prior[k] + cur[k- output_bytes])>>1)); } break;
            STBI__CASE(STBI__F_paeth)        { cur[k] = STBI__BYTECAST(raw[k] + stbi__paeth(cur[k- output_bytes],prior[k],prior[k- output_bytes])); } break;
            STBI__CASE(STBI__F_avg_first)    { cur[k] = STBI__BYTECAST(raw[k] + (cur[k- output_bytes] >> 1)); } break;
            STBI__CASE(STBI__F_paeth_first)  { cur[k] = STBI__BYTECAST(raw[k] + stbi__paeth(cur[k- output_bytes],0,0)); } break;
         }
         #undef STBI__CASE

         // the loop above sets the high byte of the pixels' alpha, but for
         // 16 bit png files we also need the low byte set. we'll do that here.
         if (depth == 16) {
            cur = a->out + stride*j; // start at the beginning of the row again
            for (i=0; i < x; ++i,cur+=output_bytes) {
               cur[filter_bytes+1] = 255;
            }
         }
      }